

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_list.c
# Opt level: O3

char ** apprun_string_list_dup(char **list)

{
  int len;
  ulong uVar1;
  char **ppcVar2;
  char *pcVar3;
  long lVar4;
  
  if (list == (char **)0x0) {
    ppcVar2 = (char **)0x0;
  }
  else {
    uVar1 = 0;
    do {
      ppcVar2 = list + uVar1;
      uVar1 = uVar1 + 1;
    } while (*ppcVar2 != (char *)0x0);
    ppcVar2 = (char **)calloc(uVar1 & 0xffffffff,8);
    pcVar3 = *list;
    if (pcVar3 != (char *)0x0) {
      lVar4 = 0;
      do {
        pcVar3 = strdup(pcVar3);
        *(char **)((long)ppcVar2 + lVar4) = pcVar3;
        pcVar3 = *(char **)((long)list + lVar4 + 8);
        lVar4 = lVar4 + 8;
      } while (pcVar3 != (char *)0x0);
    }
  }
  return ppcVar2;
}

Assistant:

char **apprun_string_list_dup(char *const *list) {
    if (list != NULL) {
        unsigned size = apprun_array_len(list);
        char **copy = apprun_string_list_alloc(size);

        apprun_string_list_copy(list, copy);

        return copy;
    } else
        return NULL;
}